

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

int gmath::anon_unknown_0::computeRationalTangentialThinPrismDistortion
              (int n,double *x,int m,double *fvec,void *up)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = *x;
  dVar2 = x[1];
  dVar3 = dVar1 * dVar1 + dVar2 * dVar2;
  dVar4 = dVar3 * dVar3;
  dVar5 = (*(double *)((long)up + 0x20) * dVar3 * dVar4 +
          *(double *)((long)up + 0x18) * dVar4 + *(double *)((long)up + 0x10) * dVar3 + 1.0) /
          (dVar3 * dVar4 * *(double *)((long)up + 0x38) +
          *(double *)((long)up + 0x30) * dVar4 + *(double *)((long)up + 0x28) * dVar3 + 1.0);
  *fvec = *(double *)((long)up + 0x60) -
          (*(double *)((long)up + 0x48) * dVar4 +
          *(double *)((long)up + 0x40) * dVar3 +
          ((dVar1 + dVar1) * dVar1 + dVar3) * *(double *)((long)up + 8) +
          dVar1 * dVar5 + (*up + *up) * dVar1 * dVar2);
  dVar1 = x[1];
  fvec[1] = *(double *)((long)up + 0x68) -
            (dVar4 * *(double *)((long)up + 0x58) +
            dVar3 * *(double *)((long)up + 0x50) +
            (*(double *)((long)up + 8) + *(double *)((long)up + 8)) * *x * dVar1 +
            dVar5 * dVar1 + ((dVar1 + dVar1) * dVar1 + dVar3) * *up);
  return 0;
}

Assistant:

int computeRationalTangentialThinPrismDistortion(int n, double x[], int m, double fvec[], void *up)
{
  RationalTangentialThinPrismDistortionParameter *p=static_cast<RationalTangentialThinPrismDistortionParameter *>(up);

  const double r2=x[0]*x[0]+x[1]*x[1];
  const double r4=r2*r2;
  const double r6=r4*r2;

  const double s=(1.0 + p->kd[0]*r2 + p->kd[1]*r4 + p->kd[2]*r6) /
                 (1.0 + p->kd[3]*r2 + p->kd[4]*r4 + p->kd[5]*r6);

  fvec[0]=p->xd - (x[0]*s + 2*p->p1*x[0]*x[1]        +   p->p2*(r2+2*x[0]*x[0]) + p->s[0]*r2 + p->s[1]*r4);
  fvec[1]=p->yd - (x[1]*s +   p->p1*(r2+2*x[1]*x[1]) + 2*p->p2*x[0]*x[1]        + p->s[2]*r2 + p->s[3]*r4);

  return 0;
}